

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

int sendPacketItem(MQTT_CLIENT *mqtt_client,uchar *data,size_t length)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  size_t length_local;
  uchar *data_local;
  MQTT_CLIENT *mqtt_client_local;
  
  iVar1 = xio_send(mqtt_client->xioHandle,data,length,sendComplete,mqtt_client);
  if (iVar1 == 0) {
    iVar1 = tickcounter_get_current_ms(mqtt_client->packetTickCntr,&mqtt_client->packetSendTimeMs);
    l._4_4_ = 0;
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"sendPacketItem",0x194,1,"Failure getting current ms tickcounter");
      }
      l._4_4_ = 0x195;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"sendPacketItem",0x189,1,"Failure sending control packet data");
    }
    l._4_4_ = 0x18a;
  }
  return l._4_4_;
}

Assistant:

static int sendPacketItem(MQTT_CLIENT* mqtt_client, const unsigned char* data, size_t length)
{
    int result = xio_send(mqtt_client->xioHandle, (const void*)data, length, sendComplete, mqtt_client);

    if (result != 0)
    {
        LogError("Failure sending control packet data");
        result = MU_FAILURE;
    }
    else
    {
#ifdef ENABLE_RAW_TRACE
        logOutgoingRawTrace(mqtt_client, (const uint8_t*)data, length);
#endif

        if (tickcounter_get_current_ms(mqtt_client->packetTickCntr, &mqtt_client->packetSendTimeMs) != 0)
        {
            LogError("Failure getting current ms tickcounter");
            result = MU_FAILURE;
        }
    }

    return result;
}